

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.c
# Opt level: O0

void mbedtls_mpi_core_shift_r(mbedtls_mpi_uint *X,size_t limbs,size_t count)

{
  mbedtls_mpi_uint mVar1;
  ulong uVar2;
  ulong uVar3;
  mbedtls_mpi_uint r1;
  mbedtls_mpi_uint r0;
  size_t v1;
  size_t v0;
  size_t i;
  size_t count_local;
  size_t limbs_local;
  mbedtls_mpi_uint *X_local;
  
  r1 = 0;
  uVar2 = count >> 6;
  uVar3 = count & 0x3f;
  if ((limbs < uVar2) || ((uVar2 == limbs && (uVar3 != 0)))) {
    memset(X,0,limbs << 3);
  }
  else {
    if (uVar2 != 0) {
      for (v0 = 0; v0 < limbs - uVar2; v0 = v0 + 1) {
        X[v0] = X[v0 + uVar2];
      }
      for (; v0 < limbs; v0 = v0 + 1) {
        X[v0] = 0;
      }
    }
    v0 = limbs;
    if (uVar3 != 0) {
      for (; v0 != 0; v0 = v0 - 1) {
        mVar1 = X[v0 - 1];
        X[v0 - 1] = X[v0 - 1] >> (sbyte)uVar3;
        X[v0 - 1] = r1 | X[v0 - 1];
        r1 = mVar1 << (0x40U - (sbyte)uVar3 & 0x3f);
      }
    }
  }
  return;
}

Assistant:

void mbedtls_mpi_core_shift_r(mbedtls_mpi_uint *X, size_t limbs,
                              size_t count)
{
    size_t i, v0, v1;
    mbedtls_mpi_uint r0 = 0, r1;

    v0 = count /  biL;
    v1 = count & (biL - 1);

    if (v0 > limbs || (v0 == limbs && v1 > 0)) {
        memset(X, 0, limbs * ciL);
        return;
    }

    /*
     * shift by count / limb_size
     */
    if (v0 > 0) {
        for (i = 0; i < limbs - v0; i++) {
            X[i] = X[i + v0];
        }

        for (; i < limbs; i++) {
            X[i] = 0;
        }
    }

    /*
     * shift by count % limb_size
     */
    if (v1 > 0) {
        for (i = limbs; i > 0; i--) {
            r1 = X[i - 1] << (biL - v1);
            X[i - 1] >>= v1;
            X[i - 1] |= r0;
            r0 = r1;
        }
    }
}